

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_booke206_tlbwe_ppc64(CPUPPCState_conflict2 *env)

{
  uint uVar1;
  uint uVar2;
  ppcmas_tlb_t *tlb;
  int iVar3;
  ulong uVar4;
  CPUPPCState_conflict2 *__mptr;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uintptr_t unaff_retaddr;
  
  uVar8 = (uint)env->spr[0x270];
  if ((uVar8 >> 0xd & 1) != 0) {
    return;
  }
  if ((0xffffffff7fffffff < env->spr[0x270]) && ((env->msr & 0x10000000) == 0)) {
    fwrite("cpu: don\'t support LRAT setting yet\n",0x24,1,_stderr);
    return;
  }
  uVar9 = uVar8 >> 0x1c & 3;
  uVar8 = (uint)env->spr[uVar9 + 0x2b0];
  tlb = booke206_cur_tlb(env);
  if (tlb == (ppcmas_tlb_t *)0x0) {
LAB_009e25c5:
    raise_exception_err_ra_ppc64(env,6,0x21,unaff_retaddr);
  }
  if ((env->spr[0x3f7] & 3) == 1) {
    uVar2 = (uint)env->spr[(ulong)uVar9 + 0x158];
  }
  else {
    uVar1 = (uint)env->spr[uVar9 + 0x2b0];
    uVar5 = uVar1 >> 0x14 & 0xf;
    uVar7 = uVar5 * 2;
    uVar2 = 0;
    for (; uVar5 <= (uVar1 >> 0x10 & 0xf); uVar5 = uVar5 + 1) {
      uVar2 = uVar2 | 1 << (uVar7 & 0x1f);
      uVar7 = uVar7 + 2;
    }
  }
  if ((((int)env->spr[0x271] < 0) && ((uVar8 & 0x4000) != 0)) &&
     ((uVar2 >> ((uint)(env->spr[0x271] >> 7) & 0x1f) & 1) == 0)) goto LAB_009e25c5;
  if ((env->msr & 0x10000000) != 0) {
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"missing HV implementation\n");
  }
  if ((int)tlb->mas1 < 0) {
    flush_page(env,tlb);
  }
  tlb->mas7_3 = env->spr[0x3b0] << 0x20 | env->spr[0x273];
  uVar2 = (uint)env->spr[0x271];
  tlb->mas1 = uVar2;
  if ((env->spr[0x3f7] & 3) == 1) {
    uVar4 = 0xffffffffffffffff;
    for (uVar6 = 0; iVar3 = (int)uVar4, uVar6 != 0x20; uVar6 = uVar6 + 1) {
      if ((env->spr[(ulong)uVar9 + 0x158] >> (uVar6 & 0x3f) & 1) != 0) {
        if (iVar3 != -1) goto LAB_009e2552;
        uVar4 = uVar6 & 0xffffffff;
      }
    }
    if (iVar3 == -1) {
      __assert_fail("tsize != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/cpu.h"
                    ,0x9ee,"void booke206_fixed_size_tlbn(CPUPPCState *, const int, ppcmas_tlb_t *)"
                   );
    }
    uVar9 = iVar3 << 7;
  }
  else {
    if ((uVar8 >> 0xe & 1) != 0) goto LAB_009e2552;
    uVar9 = uVar8 >> 0xc & 0xf00;
  }
  uVar2 = uVar2 & 0xfffff07f | uVar9;
  tlb->mas1 = uVar2;
LAB_009e2552:
  uVar6 = -0x400L << ((byte)(uVar2 >> 7) & 0x1f);
  uVar4 = uVar6 & 0xffffffff;
  if ((int)env->msr < 0) {
    uVar4 = uVar6;
  }
  tlb->mas2 = (uVar4 | 0x7f) & env->spr[0x272];
  if (-1 < (short)uVar8) {
    tlb->mas1 = uVar2 & 0xbfffffff;
  }
  flush_page(env,tlb);
  return;
}

Assistant:

void helper_booke206_tlbwe(CPUPPCState *env)
{
    uint32_t tlbncfg, tlbn;
    ppcmas_tlb_t *tlb;
    uint32_t size_tlb, size_ps;
    target_ulong mask;


    switch (env->spr[SPR_BOOKE_MAS0] & MAS0_WQ_MASK) {
    case MAS0_WQ_ALWAYS:
        /* good to go, write that entry */
        break;
    case MAS0_WQ_COND:
        /* XXX check if reserved */
        if (0) {
            return;
        }
        break;
    case MAS0_WQ_CLR_RSRV:
        /* XXX clear entry */
        return;
    default:
        /* no idea what to do */
        return;
    }

    if (((env->spr[SPR_BOOKE_MAS0] & MAS0_ATSEL) == MAS0_ATSEL_LRAT) &&
        !msr_gs) {
        /* XXX we don't support direct LRAT setting yet */
        fprintf(stderr, "cpu: don't support LRAT setting yet\n");
        return;
    }

    tlbn = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlbn];

    tlb = booke206_cur_tlb(env);

    if (!tlb) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    }

    /* check that we support the targeted size */
    size_tlb = (env->spr[SPR_BOOKE_MAS1] & MAS1_TSIZE_MASK) >> MAS1_TSIZE_SHIFT;
    size_ps = booke206_tlbnps(env, tlbn);
    if ((env->spr[SPR_BOOKE_MAS1] & MAS1_VALID) && (tlbncfg & TLBnCFG_AVAIL) &&
        !(size_ps & (1 << size_tlb))) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    }

    if (msr_gs) {
        cpu_abort(env_cpu(env), "missing HV implementation\n");
    }

    if (tlb->mas1 & MAS1_VALID) {
        /*
         * Invalidate the page in QEMU TLB if it was a valid entry.
         *
         * In "PowerPC e500 Core Family Reference Manual, Rev. 1",
         * Section "12.4.2 TLB Write Entry (tlbwe) Instruction":
         * (https://www.nxp.com/docs/en/reference-manual/E500CORERM.pdf)
         *
         * "Note that when an L2 TLB entry is written, it may be displacing an
         * already valid entry in the same L2 TLB location (a victim). If a
         * valid L1 TLB entry corresponds to the L2 MMU victim entry, that L1
         * TLB entry is automatically invalidated."
         */
        flush_page(env, tlb);
    }

    tlb->mas7_3 = ((uint64_t)env->spr[SPR_BOOKE_MAS7] << 32) |
        env->spr[SPR_BOOKE_MAS3];
    tlb->mas1 = env->spr[SPR_BOOKE_MAS1];

    if ((env->spr[SPR_MMUCFG] & MMUCFG_MAVN) == MMUCFG_MAVN_V2) {
        /* For TLB which has a fixed size TSIZE is ignored with MAV2 */
        booke206_fixed_size_tlbn(env, tlbn, tlb);
    } else {
        if (!(tlbncfg & TLBnCFG_AVAIL)) {
            /* force !AVAIL TLB entries to correct page size */
            tlb->mas1 &= ~MAS1_TSIZE_MASK;
            /* XXX can be configured in MMUCSR0 */
            tlb->mas1 |= (tlbncfg & TLBnCFG_MINSIZE) >> 12;
        }
    }

    /* Make a mask from TLB size to discard invalid bits in EPN field */
    mask = ~(booke206_tlb_to_page_size(env, tlb) - 1);
    /* Add a mask for page attributes */
    mask |= MAS2_ACM | MAS2_VLE | MAS2_W | MAS2_I | MAS2_M | MAS2_G | MAS2_E;

    if (!msr_cm) {
        /*
         * Executing a tlbwe instruction in 32-bit mode will set bits
         * 0:31 of the TLB EPN field to zero.
         */
        mask &= 0xffffffff;
    }

    tlb->mas2 = env->spr[SPR_BOOKE_MAS2] & mask;

    if (!(tlbncfg & TLBnCFG_IPROT)) {
        /* no IPROT supported by TLB */
        tlb->mas1 &= ~MAS1_IPROT;
    }

    flush_page(env, tlb);
}